

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

string * cmCatViews(string *__return_storage_ptr__,
                   initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                   views)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  string *psVar4;
  const_iterator ppVar5;
  const_pointer __first;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *view_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *__range1_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  iterator sit;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  char *local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  difference_type local_70;
  size_type initialLen;
  const_iterator local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *view;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  *__range1;
  size_t rvalueStringOffset;
  size_t rvalueStringLength;
  string *rvalueString;
  size_t totalSize;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_local;
  string *result;
  
  views_local._M_array = (iterator)views._M_len;
  totalSize = (size_t)views._M_array;
  rvalueString = (string *)0x0;
  rvalueStringLength = 0;
  rvalueStringOffset = 0;
  __range1 = (initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)0x0;
  __begin1 = (const_iterator)&totalSize;
  views_local._M_len = (size_type)__return_storage_ptr__;
  __end1 = std::
           initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
           ::begin((initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                    *)__begin1);
  view = std::
         initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
         ::end((initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *)__begin1);
  do {
    if (__end1 == view) {
      initialLen._7_1_ = 0;
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_70 = 0;
      if ((rvalueStringLength == 0) ||
         (psVar4 = (string *)std::__cxx11::string::capacity(), psVar4 < rvalueString)) {
        rvalueStringLength = 0;
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,(string *)rvalueStringLength);
      }
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      if ((rvalueStringLength != 0) &&
         (__range1 !=
          (initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
           *)0x0)) {
        local_88._M_current = (char *)std::__cxx11::string::begin();
        local_98._M_current = (char *)std::__cxx11::string::begin();
        local_90 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_98,rvalueStringOffset);
        local_b0._M_current = (char *)std::__cxx11::string::begin();
        local_a8 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_b0,(difference_type)__range1);
        local_a0 = (char *)__gnu_cxx::
                           __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator+(&local_a8,rvalueStringOffset);
        sit._M_current =
             (char *)std::
                     copy_backward<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                               (local_88,local_90,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_a0);
      }
      __range1_1 = (initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                    *)std::__cxx11::string::begin();
      local_c0 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&__range1_1,local_70);
      __end1_1 = std::
                 initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                 ::begin((initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                          *)&totalSize);
      ppVar5 = std::
               initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
               ::end((initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                      *)&totalSize);
      for (; __end1_1 != ppVar5; __end1_1 = __end1_1 + 1) {
        if ((rvalueStringLength == 0) ||
           (__end1_1->second !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rvalueStringLength)
           ) {
          __first = std::basic_string_view<char,_std::char_traits<char>_>::data(&__end1_1->first);
          sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&__end1_1->first);
          local_c0 = std::
                     copy_n<char_const*,unsigned_long,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                               (__first,sVar3,local_c0);
        }
        else {
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator+=(&local_c0,rvalueStringOffset);
        }
      }
      return __return_storage_ptr__;
    }
    local_60 = __end1;
    if (__end1->second != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      if (rvalueStringLength != 0) {
        uVar1 = std::__cxx11::string::capacity();
        uVar2 = std::__cxx11::string::capacity();
        if (uVar1 <= uVar2) goto LAB_001536cf;
      }
      rvalueStringLength = (size_t)local_60->second;
      rvalueStringOffset = std::__cxx11::string::length();
      __range1 = (initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                  *)rvalueString;
    }
LAB_001536cf:
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_60->first);
    rvalueString = (string *)(&rvalueString->_M_dataplus + sVar3);
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

std::string cmCatViews(
  std::initializer_list<std::pair<cm::string_view, std::string*>> views)
{
  std::size_t totalSize = 0;
  std::string* rvalueString = nullptr;
  std::size_t rvalueStringLength = 0;
  std::size_t rvalueStringOffset = 0;
  for (auto const& view : views) {
    // Find the rvalue string with the largest capacity.
    if (view.second &&
        (!rvalueString ||
         view.second->capacity() > rvalueString->capacity())) {
      rvalueString = view.second;
      rvalueStringLength = rvalueString->length();
      rvalueStringOffset = totalSize;
    }
    totalSize += view.first.size();
  }

  std::string result;
  std::string::size_type initialLen = 0;
  if (rvalueString && rvalueString->capacity() >= totalSize) {
    result = std::move(*rvalueString);
  } else {
    rvalueString = nullptr;
  }
  result.resize(totalSize);
  if (rvalueString && rvalueStringOffset > 0) {
    std::copy_backward(result.begin(), result.begin() + rvalueStringLength,
                       result.begin() + rvalueStringOffset +
                         rvalueStringLength);
  }
  std::string::iterator sit = result.begin() + initialLen;
  for (auto const& view : views) {
    if (rvalueString && view.second == rvalueString) {
      sit += rvalueStringLength;
    } else {
      sit = std::copy_n(view.first.data(), view.first.size(), sit);
    }
  }
  return result;
}